

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool Catch::compareEqual<std::basic_string_view<char,std::char_traits<char>>,char[5]>
               (basic_string_view<char,_std::char_traits<char>_> *lhs,char (*rhs) [5])

{
  size_t __n;
  char *__s1;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_type __rlen;
  
  __n = lhs->_M_len;
  __s1 = lhs->_M_str;
  sVar3 = strlen(*rhs);
  if (__n == sVar3) {
    if (__n != 0) {
      iVar2 = bcmp(__s1,rhs,__n);
      if (iVar2 != 0) goto LAB_0016265a;
    }
    bVar1 = true;
  }
  else {
LAB_0016265a:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

auto compareEqual( LhsT const& lhs, RhsT const& rhs ) -> bool { return static_cast<bool>(lhs == rhs); }